

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_handler.hpp
# Opt level: O2

void __thiscall
asio::detail::
wait_handler<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_asio::any_io_executor>
::wait_handler(wait_handler<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_asio::any_io_executor>
               *this,_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>
                     *h,any_io_executor *io_ex)

{
  undefined8 uVar1;
  
  wait_op::wait_op(&this->super_wait_op,do_complete);
  uVar1 = *(undefined8 *)&h->field_0x8;
  (this->handler_)._M_f = h->_M_f;
  *(undefined8 *)&(this->handler_).field_0x8 = uVar1;
  (this->handler_)._M_bound_args.
  super__Tuple_impl<0UL,_nuraft::asio_service_impl_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_nuraft::asio_service_impl_*,_false>._M_head_impl =
       (h->_M_bound_args).super__Tuple_impl<0UL,_nuraft::asio_service_impl_*,_std::_Placeholder<1>_>
       .super__Head_base<0UL,_nuraft::asio_service_impl_*,_false>._M_head_impl;
  handler_work<std::_Bind<void_(nuraft::asio_service_impl::*(nuraft::asio_service_impl_*,_std::_Placeholder<1>))(std::error_code)>,_asio::any_io_executor,_void>
  ::handler_work(&this->work_,&this->handler_,io_ex);
  return;
}

Assistant:

wait_handler(Handler& h, const IoExecutor& io_ex)
    : wait_op(&wait_handler::do_complete),
      handler_(ASIO_MOVE_CAST(Handler)(h)),
      work_(handler_, io_ex)
  {
  }